

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decodemv.c
# Opt level: O3

int read_skip_txfm(AV1_COMMON *cm,MACROBLOCKD *xd,int segment_id,aom_reader *r)

{
  ushort uVar1;
  ushort uVar2;
  FRAME_CONTEXT *pFVar3;
  short sVar4;
  int iVar5;
  ulong uVar6;
  byte bVar7;
  ulong uVar8;
  long lVar9;
  aom_cdf_prob (*icdf) [3];
  
  if (((cm->seg).enabled == '\0') ||
     (iVar5 = 1, ((cm->seg).feature_mask[(ulong)(uint)segment_id & 0xff] & 0x40) == 0)) {
    if (xd->above_mbmi == (MB_MODE_INFO *)0x0) {
      uVar6 = 0;
    }
    else {
      uVar6 = (ulong)xd->above_mbmi->skip_txfm;
    }
    if (xd->left_mbmi == (MB_MODE_INFO *)0x0) {
      uVar8 = 0;
    }
    else {
      uVar8 = (ulong)xd->left_mbmi->skip_txfm;
    }
    lVar9 = uVar8 + uVar6;
    pFVar3 = xd->tile_ctx;
    icdf = pFVar3->skip_txfm_cdfs + lVar9;
    iVar5 = od_ec_decode_cdf_q15(&r->ec,*icdf,2);
    if (r->allow_update_cdf != '\0') {
      uVar1 = pFVar3->skip_txfm_cdfs[lVar9][2];
      bVar7 = (char)(uVar1 >> 4) + 4;
      uVar2 = (*icdf)[0];
      if ((char)iVar5 < '\x01') {
        sVar4 = -(uVar2 >> (bVar7 & 0x1f));
      }
      else {
        sVar4 = (short)((int)(0x8000 - (uint)uVar2) >> (bVar7 & 0x1f));
      }
      (*icdf)[0] = sVar4 + uVar2;
      pFVar3->skip_txfm_cdfs[lVar9][2] = uVar1 + (uVar1 < 0x20);
    }
  }
  return iVar5;
}

Assistant:

static int read_skip_txfm(AV1_COMMON *cm, const MACROBLOCKD *xd, int segment_id,
                          aom_reader *r) {
  if (segfeature_active(&cm->seg, segment_id, SEG_LVL_SKIP)) {
    return 1;
  } else {
    const int ctx = av1_get_skip_txfm_context(xd);
    FRAME_CONTEXT *ec_ctx = xd->tile_ctx;
    const int skip_txfm =
        aom_read_symbol(r, ec_ctx->skip_txfm_cdfs[ctx], 2, ACCT_STR);
    return skip_txfm;
  }
}